

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O3

int insert_at(quicly_ranges_t *ranges,uint64_t start,uint64_t end,size_t slot)

{
  ulong uVar1;
  quicly_range_t *__src;
  quicly_range_t *__dest;
  size_t _n;
  size_t sVar2;
  
  uVar1 = ranges->num_ranges;
  if (uVar1 == ranges->capacity) {
    sVar2 = 4;
    if (3 < uVar1) {
      sVar2 = uVar1 * 2;
    }
    __dest = (quicly_range_t *)malloc(sVar2 << 4);
    if (__dest == (quicly_range_t *)0x0) {
      return 0x201;
    }
    __src = ranges->ranges;
    if (slot != 0) {
      memcpy(__dest,__src,slot << 4);
    }
    if (uVar1 - slot != 0) {
      memcpy(__dest + slot + 1,__src + slot,(uVar1 - slot) * 0x10);
    }
    if (__src != &ranges->_initial) {
      free(__src);
    }
    ranges->ranges = __dest;
    ranges->capacity = sVar2;
  }
  else {
    __dest = ranges->ranges;
    if (uVar1 - slot != 0) {
      memmove(__dest + slot + 1,__dest + slot,(uVar1 - slot) * 0x10);
      __dest = ranges->ranges;
    }
  }
  __dest[slot].start = start;
  __dest[slot].end = end;
  ranges->num_ranges = ranges->num_ranges + 1;
  return 0;
}

Assistant:

static int insert_at(quicly_ranges_t *ranges, uint64_t start, uint64_t end, size_t slot)
{
    if (ranges->num_ranges == ranges->capacity) {
        size_t new_capacity = ranges->capacity < 4 ? 4 : ranges->capacity * 2;
        quicly_range_t *new_ranges = malloc(new_capacity * sizeof(*new_ranges));
        if (new_ranges == NULL)
            return PTLS_ERROR_NO_MEMORY;
        COPY(new_ranges, ranges->ranges, slot);
        COPY(new_ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
        if (ranges->ranges != &ranges->_initial)
            free(ranges->ranges);
        ranges->ranges = new_ranges;
        ranges->capacity = new_capacity;
    } else {
        MOVE(ranges->ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
    }
    ranges->ranges[slot] = (quicly_range_t){start, end};
    ++ranges->num_ranges;
    return 0;
}